

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O1

void __thiscall Tle::ExtractExponential(Tle *this,string *str,double *val)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  runtime_error *prVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  undefined1 local_50 [8];
  string temp;
  
  local_50 = (undefined1  [8])&temp._M_string_length;
  temp._M_dataplus._M_p = (pointer)0x0;
  temp._M_string_length._0_1_ = 0;
  if (str->_M_string_length != 0) {
    pcVar5 = (str->_M_dataplus)._M_p;
    pcVar3 = pcVar5 + str->_M_string_length;
    pcVar7 = pcVar5;
    do {
      cVar6 = (char)local_50;
      if (pcVar7 == pcVar5) {
        cVar1 = *pcVar7;
        if ((cVar1 != ' ') && (cVar1 != '+')) {
          if (cVar1 != '-') {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Invalid sign");
            goto LAB_001148d8;
          }
          std::__cxx11::string::push_back(cVar6);
        }
        std::__cxx11::string::push_back(cVar6);
      }
      else {
        cVar1 = *pcVar7;
        if (pcVar7 == pcVar3 + -2) {
          if ((cVar1 != '-') && (cVar1 != '+')) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Invalid exponential sign");
            goto LAB_001148d8;
          }
          std::__cxx11::string::push_back(cVar6);
        }
        else if (9 < (int)cVar1 - 0x30U) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"Invalid digit");
LAB_001148d8:
          *(undefined ***)prVar4 = &PTR__runtime_error_0011acf0;
          __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::string::push_back(cVar6);
      pcVar7 = pcVar7 + 1;
      pcVar5 = (str->_M_dataplus)._M_p;
      pcVar3 = pcVar5 + str->_M_string_length;
    } while (pcVar7 != pcVar3);
  }
  bVar2 = Util::FromString<double>((string *)local_50,val);
  if (bVar2) {
    if (local_50 != (undefined1  [8])&temp._M_string_length) {
      operator_delete((void *)local_50);
    }
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Failed to convert value to double");
  *(undefined ***)prVar4 = &PTR__runtime_error_0011acf0;
  __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Tle::ExtractExponential(const std::string& str, double& val)
{
    std::string temp;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        if (i == str.begin())
        {
            if (*i == '-' || *i == '+' || *i == ' ')
            {
                if (*i == '-')
                {
                    temp += *i;
                }
                temp += '0';
                temp += '.';
            }
            else
            {
                throw TleException("Invalid sign");
            }
        }
        else if (i == str.end() - 2)
        {
            if (*i == '-' || *i == '+')
            {
                temp += 'e';
                temp += *i;
            }
            else
            {
                throw TleException("Invalid exponential sign");
            }
        }
        else
        {
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}